

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O2

string * __thiscall
RenX::getFormattedPlayerName_abi_cxx11_
          (string *__return_storage_ptr__,RenX *this,PlayerInfo *player)

{
  string_view local_20;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 400));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\x03");
  local_20 = getTeamColor(*(TeamType *)(this + 0xf8));
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,&local_20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string RenX::getFormattedPlayerName(const RenX::PlayerInfo &player)
{
	std::string r = player.formatNamePrefix;
	r += IRCCOLOR;
	r += RenX::getTeamColor(player.team);
	r += player.name;
	return r;
}